

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_deflate(archive *a,la_zstream *lastrm,int level,int withheader)

{
  int iVar1;
  z_streamp strm_00;
  z_stream *strm;
  int withheader_local;
  int level_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  strm_00 = (z_streamp)calloc(1,0x70);
  if (strm_00 == (z_streamp)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate memory for gzip stream");
    a_local._4_4_ = -0x1e;
  }
  else {
    strm_00->next_in = lastrm->next_in;
    strm_00->avail_in = (uInt)lastrm->avail_in;
    strm_00->total_in = lastrm->total_in;
    strm_00->next_out = lastrm->next_out;
    strm_00->avail_out = (uInt)lastrm->avail_out;
    strm_00->total_out = lastrm->total_out;
    iVar1 = -0xf;
    if (withheader != 0) {
      iVar1 = 0xf;
    }
    iVar1 = cm_zlib_deflateInit2_(strm_00,level,8,iVar1,8,0,"1.2.12",0x70);
    if (iVar1 == 0) {
      lastrm->real_stream = strm_00;
      lastrm->valid = 1;
      lastrm->code = compression_code_deflate;
      lastrm->end = compression_end_deflate;
      a_local._4_4_ = 0;
    }
    else {
      free(strm_00);
      lastrm->real_stream = (void *)0x0;
      archive_set_error(a,-1,"Internal error initializing compression library");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_deflate(struct archive *a,
    struct la_zstream *lastrm, int level, int withheader)
{
	z_stream *strm;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for gzip stream");
		return (ARCHIVE_FATAL);
	}
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	if (deflateInit2(strm, level, Z_DEFLATED,
	    (withheader)?15:-15,
	    8, Z_DEFAULT_STRATEGY) != Z_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lastrm->real_stream = strm;
	lastrm->valid = 1;
	lastrm->code = compression_code_deflate;
	lastrm->end = compression_end_deflate;
	return (ARCHIVE_OK);
}